

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O2

void __thiscall kj::Arena::cleanup(Arena *this,EVP_PKEY_CTX *ctx)

{
  ObjectHeader *pOVar1;
  _func_void_void_ptr *p_Var2;
  ChunkHeader *pCVar3;
  
  while (pOVar1 = this->objectList, pOVar1 != (ObjectHeader *)0x0) {
    p_Var2 = pOVar1->destructor;
    this->objectList = pOVar1->next;
    (*p_Var2)(pOVar1 + 1);
  }
  while (pCVar3 = this->chunkList, pCVar3 != (ChunkHeader *)0x0) {
    this->chunkList = pCVar3->next;
    operator_delete(pCVar3);
  }
  return;
}

Assistant:

void Arena::cleanup() {
  while (objectList != nullptr) {
    void* ptr = objectList + 1;
    auto destructor = objectList->destructor;
    objectList = objectList->next;
    destructor(ptr);
  }

  while (chunkList != nullptr) {
    void* ptr = chunkList;
    chunkList = chunkList->next;
    operator delete(ptr);
  }
}